

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall chrono::ChForce::ChForce(ChForce *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  undefined1 auVar9 [32];
  
  ChObj::ChObj(&this->super_ChObj);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChForce_0114f730;
  this->Body = (ChBody *)0x0;
  this->mode = FORCE;
  this->frame = BODY;
  this->align = BODY_DIR;
  auVar5 = _DAT_011dd3e0;
  auVar8._8_8_ = VNULL;
  auVar8._0_8_ = VNULL;
  auVar9._16_8_ = VNULL;
  auVar9._0_16_ = auVar8;
  auVar9._24_8_ = VNULL;
  auVar6 = vpermpd_avx2(ZEXT1632(_DAT_011dd3e0),0xd0);
  auVar6 = vblendps_avx(auVar9,auVar6,0x3c);
  this->vpoint = (ChVector<double>)auVar6._0_24_;
  (this->vrelpoint).m_data[0] = (double)auVar6._24_8_;
  *(undefined1 (*) [16])((this->vrelpoint).m_data + 1) = auVar5;
  auVar6 = ZEXT1232(ZEXT812(0)) << 0x20;
  this->move_x = (shared_ptr<chrono::ChFunction>)auVar6._0_16_;
  this->move_y = (shared_ptr<chrono::ChFunction>)auVar6._16_16_;
  this->move_y = (shared_ptr<chrono::ChFunction>)auVar6._0_16_;
  this->move_z = (shared_ptr<chrono::ChFunction>)auVar6._16_16_;
  auVar7 = ZEXT464(0) << 0x20;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->restpos).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->restpos).m_data + 1) = auVar5;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->f_x = (shared_ptr<chrono::ChFunction>)auVar7._0_16_;
  this->f_y = (shared_ptr<chrono::ChFunction>)auVar7._16_16_;
  this->f_z = (shared_ptr<chrono::ChFunction>)auVar7._32_16_;
  this->mforce = (double)auVar7._48_8_;
  (this->modula).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar7._56_8_;
  auVar2._8_8_ = DAT_011dd3f8;
  auVar2._0_8_ = VECT_X;
  auVar4._8_8_ = DAT_011dd400;
  auVar4._0_8_ = DAT_011dd3f8;
  auVar3 = vunpcklpd_avx(auVar2,auVar4);
  auVar2 = vshufpd_avx(auVar4,auVar2,1);
  *(undefined1 (*) [16])((this->vdir).m_data + 2) = auVar2;
  *(undefined1 (*) [16])(this->vdir).m_data = auVar3;
  *(undefined1 (*) [16])((this->vreldir).m_data + 1) = auVar4;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->force).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->force).m_data + 1) = auVar5;
  dVar1 = (double)vmovlps_avx(auVar8);
  (this->relforce).m_data[0] = dVar1;
  *(undefined1 (*) [16])((this->relforce).m_data + 1) = auVar5;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->modula,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->move_x,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->move_y,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->move_z,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->f_x,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->f_y,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->f_z,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChForce::ChForce()
    : Body(nullptr),
      mode(FORCE),
      frame(BODY),
      align(BODY_DIR),
      vpoint(VNULL),
      vrelpoint(VNULL),
      restpos(VNULL),
      mforce(0),
      vdir(VECT_X),
      vreldir(VECT_X),
      force(VNULL),
      relforce(VNULL) {
    modula = chrono_types::make_shared<ChFunction_Const>(1);
    move_x = chrono_types::make_shared<ChFunction_Const>(0);
    move_y = chrono_types::make_shared<ChFunction_Const>(0);
    move_z = chrono_types::make_shared<ChFunction_Const>(0);
    f_x = chrono_types::make_shared<ChFunction_Const>(0);
    f_y = chrono_types::make_shared<ChFunction_Const>(0);
    f_z = chrono_types::make_shared<ChFunction_Const>(0);
}